

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

void __thiscall lsim::Simulator::pin_set_default(Simulator *this,pin_t pin,Value value)

{
  size_type sVar1;
  reference pvVar2;
  value_type node_id;
  Value value_local;
  pin_t pin_local;
  Simulator *this_local;
  
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_pin_nodes);
  if (pin < sVar1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_pin_nodes,(ulong)pin);
    node_set_default(this,*pvVar2,value);
    return;
  }
  __assert_fail("pin < m_pin_nodes.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0x46,"void lsim::Simulator::pin_set_default(pin_t, Value)");
}

Assistant:

void Simulator::pin_set_default(pin_t pin, Value value) {
    assert(pin < m_pin_nodes.size());

    auto node_id = m_pin_nodes[pin];
    node_set_default(node_id, value);
}